

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtPolyhedralConvexShape::localGetSupportingVertexWithoutMargin
          (cbtPolyhedralConvexShape *this,cbtVector3 *vec0)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long lVar4;
  ulong *puVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [64];
  cbtVector3 cVar13;
  cbtVector3 temp [128];
  float local_868;
  float local_864;
  float local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined8 local_838;
  ulong local_830 [256];
  
  local_864 = vec0->m_floats[0];
  local_868 = vec0->m_floats[1];
  fVar11 = vec0->m_floats[2];
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_868 * local_868)),ZEXT416((uint)local_864),
                           ZEXT416((uint)local_864));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
  fVar10 = auVar1._0_4_;
  if (0.0001 <= fVar10) {
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      auVar1 = vsqrtss_avx(auVar1,auVar1);
      fVar10 = auVar1._0_4_;
    }
    fVar10 = 1.0 / fVar10;
    local_864 = local_864 * fVar10;
    local_868 = local_868 * fVar10;
    fVar11 = fVar11 * fVar10;
  }
  else {
    local_868 = 0.0;
    local_864 = 1.0;
    fVar11 = 0.0;
  }
  iVar2 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0x19])(this);
  if (iVar2 < 1) {
    local_858._0_8_ = 0;
    local_848._0_8_ = 0;
  }
  else {
    local_848 = ZEXT816(0);
    local_860 = -1e+18;
    iVar2 = 0;
    local_858._0_12_ = ZEXT812(0);
    local_858._12_4_ = 0;
    do {
      iVar3 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                _vptr_cbtCollisionShape[0x19])(this);
      uVar6 = 0x80;
      if (iVar3 - iVar2 < 0x80) {
        iVar3 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                  _vptr_cbtCollisionShape[0x19])(this);
        uVar6 = iVar3 - iVar2;
      }
      if (0 < (int)uVar6) {
        puVar8 = &local_838;
        uVar9 = 0;
        do {
          (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0x1c])(this,uVar9 & 0xffffffff,puVar8);
          uVar9 = uVar9 + 1;
          puVar8 = puVar8 + 2;
        } while (uVar6 != uVar9);
      }
      if ((int)uVar6 < 1) {
        lVar4 = -1;
        fVar10 = -3.4028235e+38;
      }
      else {
        uVar9 = 0xffffffff;
        puVar5 = local_830;
        uVar7 = 0;
        auVar12 = ZEXT464(0xff7fffff);
        do {
          auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_868 * *(float *)((long)puVar5 + -4))),
                                   ZEXT416((uint)local_864),ZEXT416((uint)puVar5[-1]));
          auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar11),ZEXT416((uint)*puVar5));
          if (auVar12._0_4_ < auVar1._0_4_) {
            uVar9 = uVar7 & 0xffffffff;
          }
          auVar1 = vmaxss_avx(auVar1,auVar12._0_16_);
          auVar12 = ZEXT1664(auVar1);
          fVar10 = auVar1._0_4_;
          uVar7 = uVar7 + 1;
          puVar5 = puVar5 + 2;
        } while ((long)(int)uVar6 != uVar7);
        lVar4 = (long)(int)uVar9;
      }
      if (local_860 < fVar10) {
        local_858._8_8_ = 0;
        local_858._0_8_ = (&local_838)[lVar4 * 2];
        local_848._8_8_ = 0;
        local_848._0_8_ = local_830[lVar4 * 2];
        local_860 = fVar10;
      }
      iVar2 = iVar2 + 0x80;
      iVar3 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                _vptr_cbtCollisionShape[0x19])(this);
    } while (iVar2 < iVar3);
  }
  cVar13.m_floats[2] = (cbtScalar)local_848._0_4_;
  cVar13.m_floats[3] = (cbtScalar)local_848._4_4_;
  cVar13.m_floats[0] = (cbtScalar)local_858._0_4_;
  cVar13.m_floats[1] = (cbtScalar)local_858._4_4_;
  return (cbtVector3)cVar13.m_floats;
}

Assistant:

cbtVector3 cbtPolyhedralConvexShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0) const
{
	cbtVector3 supVec(0, 0, 0);
#ifndef __SPU__
	int i;
	cbtScalar maxDot(cbtScalar(-BT_LARGE_FLOAT));

	cbtVector3 vec = vec0;
	cbtScalar lenSqr = vec.length2();
	if (lenSqr < cbtScalar(0.0001))
	{
		vec.setValue(1, 0, 0);
	}
	else
	{
		cbtScalar rlen = cbtScalar(1.) / cbtSqrt(lenSqr);
		vec *= rlen;
	}

	cbtVector3 vtx;
	cbtScalar newDot;

	for (int k = 0; k < getNumVertices(); k += 128)
	{
		cbtVector3 temp[128];
		int inner_count = MIN(getNumVertices() - k, 128);
		for (i = 0; i < inner_count; i++)
			getVertex(i, temp[i]);
		i = (int)vec.maxDot(temp, inner_count, newDot);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = temp[i];
		}
	}

#endif  //__SPU__
	return supVec;
}